

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O2

spv_result_t spvtools::val::MemoryPass(ValidationState_t *_,Instruction *inst)

{
  CapabilitySet *pCVar1;
  size_t index;
  size_t index_00;
  ushort uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  uint32_t id;
  pointer puVar5;
  _Alloc_hider _Var6;
  bool bVar7;
  byte bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  StorageClass SVar15;
  uint uVar16;
  uint id_00;
  uint id_01;
  uint id_02;
  uint id_03;
  uint uVar17;
  AddressingModel AVar18;
  int32_t iVar19;
  uint32_t uVar20;
  spv_result_t sVar21;
  uint uVar22;
  int iVar23;
  TensorAddressingOperandsMask TVar24;
  StorageClass SVar25;
  uint uVar26;
  size_t i;
  char *pcVar27;
  Instruction *pIVar28;
  Instruction *pIVar29;
  Instruction *pIVar30;
  Instruction *pIVar31;
  Function *pFVar32;
  undefined4 extraout_var;
  short sVar33;
  byte bVar34;
  bool bVar35;
  byte bVar36;
  size_t sVar37;
  byte bVar38;
  ulong uVar39;
  char *operand_name;
  string *__return_storage_ptr__;
  Op opcode;
  long lVar40;
  char *local_2e0;
  string instr_name;
  anon_class_24_3_e757d3e0 ValidateType;
  uint64_t stride_value;
  Instruction *local_268;
  size_t local_260;
  size_t local_258;
  char *opcode_name;
  undefined8 local_230;
  tuple<bool,_bool,_unsigned_int> k_eval;
  tuple<bool,_bool,_unsigned_int> rc_eval;
  string errorVUID;
  spv_result_t local_48;
  tuple<bool,_bool,_unsigned_int> input_interp_eval;
  
  uVar2 = *(ushort *)
           ((long)&(inst->operands_).
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_start + 2);
  opcode = (Op)uVar2;
  switch(uVar2) {
  case 0x3b:
switchD_0058cd54_caseD_1142:
    sVar21 = anon_unknown_2::ValidateVariable(_,inst);
    break;
  case 0x3c:
  case 0x45:
    goto switchD_0058d24a_caseD_14f1;
  case 0x3d:
    pIVar28 = ValidationState_t::FindDef
                        (_,*(uint32_t *)
                            &(inst->operands_).
                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
    if (pIVar28 == (Instruction *)0x0) {
      ValidationState_t::diag
                ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::operator<<((ostream *)&errorVUID,"OpLoad Result Type <id> ");
      uVar20 = *(uint32_t *)
                &(inst->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      goto LAB_0058e2a8;
    }
    uVar16 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,2);
    pIVar31 = ValidationState_t::FindDef(_,uVar16);
    if (pIVar31 == (Instruction *)0x0) {
LAB_0058e7e9:
      ValidationState_t::diag
                ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::operator<<((ostream *)&errorVUID,"OpLoad Pointer <id> ");
      goto LAB_0058e81f;
    }
    AVar18 = ValidationState_t::addressing_model(_);
    if (AVar18 == AddressingModelLogical) {
      bVar8 = (_->features_).variable_pointers;
      if ((bool)bVar8 == false) {
        iVar19 = spvOpcodeReturnsLogicalPointer((uint)(pIVar31->inst_).opcode);
        if (iVar19 == 0) goto LAB_0058e7e9;
        bVar8 = (_->features_).variable_pointers;
      }
      if (((bVar8 & 1) != 0) &&
         (bVar14 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar31->inst_).opcode), !bVar14))
      goto LAB_0058e7e9;
    }
    pIVar29 = ValidationState_t::FindDef(_,(pIVar31->inst_).type_id);
    if (pIVar29 != (Instruction *)0x0) {
      uVar4 = (pIVar29->inst_).opcode;
      if (uVar4 != 0x20) {
        if (uVar4 == 0x1141) goto LAB_0058ee9c;
        goto LAB_0058d721;
      }
      uVar22 = Instruction::GetOperandAs<unsigned_int>(pIVar29,2);
      pIVar29 = ValidationState_t::FindDef(_,uVar22);
      if ((pIVar29 != (Instruction *)0x0) &&
         ((pIVar28->inst_).result_id == (pIVar29->inst_).result_id)) {
LAB_0058ee9c:
        if ((_->options_->before_hlsl_legalization == false) &&
           (bVar14 = ValidationState_t::ContainsRuntimeArray
                               (_,*(uint32_t *)
                                   &(inst->operands_).
                                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                    ._M_impl.super__Vector_impl_data._M_finish), bVar14)) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          pcVar27 = "Cannot load a runtime-sized array";
        }
        else {
          sVar21 = anon_unknown_2::CheckMemoryAccess(_,inst,3);
          if (sVar21 != SPV_SUCCESS) {
            return sVar21;
          }
          bVar14 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
          if (((!bVar14) ||
              (bVar14 = ValidationState_t::ContainsLimitedUseIntOrFloatType
                                  (_,*(uint32_t *)
                                      &(inst->operands_).
                                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                       ._M_impl.super__Vector_impl_data._M_finish), !bVar14)) ||
             ((uVar39 = (ulong)(pIVar28->inst_).opcode, uVar39 < 0x21 &&
              ((0x101e00000U >> (uVar39 & 0x3f) & 1) != 0)))) {
            ValidationState_t::RegisterQCOMImageProcessingTextureConsumer
                      (_,uVar16,(Instruction *)inst,(Instruction *)0x0);
            goto switchD_0058d24a_caseD_14f1;
          }
          ValidationState_t::diag
                    ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          pcVar27 = "8- or 16-bit loads must be a scalar, vector or matrix type";
        }
        goto LAB_0058e468;
      }
      ValidationState_t::diag
                ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::operator<<((ostream *)&errorVUID,"OpLoad Result Type <id> ");
      ValidationState_t::getIdName_abi_cxx11_
                (&instr_name,_,
                 *(uint32_t *)
                  &(inst->operands_).
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
      std::operator<<((ostream *)&errorVUID," does not match Pointer <id> ");
      uVar20 = (pIVar31->inst_).result_id;
LAB_0058f20c:
      __return_storage_ptr__ = (string *)&ValidateType;
LAB_0058f211:
      ValidationState_t::getIdName_abi_cxx11_(__return_storage_ptr__,_,uVar20);
      std::operator<<((ostream *)&errorVUID,(string *)__return_storage_ptr__);
      pcVar27 = "s type.";
LAB_0058f2f7:
      std::operator<<((ostream *)&errorVUID,pcVar27);
      std::__cxx11::string::_M_dispose();
      goto LAB_0058ed5b;
    }
LAB_0058d721:
    ValidationState_t::diag
              ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
    std::operator<<((ostream *)&errorVUID,"OpLoad type for pointer <id> ");
    goto LAB_0058dfe5;
  case 0x3e:
    uVar16 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,0);
    pIVar28 = ValidationState_t::FindDef(_,uVar16);
    if (pIVar28 == (Instruction *)0x0) {
LAB_0058e40e:
      ValidationState_t::diag
                ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::operator<<((ostream *)&errorVUID,"OpStore Pointer <id> ");
      goto LAB_0058e4f7;
    }
    AVar18 = ValidationState_t::addressing_model(_);
    if (AVar18 == AddressingModelLogical) {
      bVar8 = (_->features_).variable_pointers;
      if ((bool)bVar8 == false) {
        iVar19 = spvOpcodeReturnsLogicalPointer((uint)(pIVar28->inst_).opcode);
        if (iVar19 == 0) goto LAB_0058e40e;
        bVar8 = (_->features_).variable_pointers;
      }
      if (((bVar8 & 1) != 0) &&
         (bVar14 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar28->inst_).opcode), !bVar14))
      goto LAB_0058e40e;
    }
    pIVar31 = ValidationState_t::FindDef(_,(pIVar28->inst_).type_id);
    if (pIVar31 != (Instruction *)0x0) {
      uVar4 = (pIVar31->inst_).opcode;
      if (uVar4 == 0x20) {
        uVar22 = Instruction::GetOperandAs<unsigned_int>(pIVar31,2);
        pIVar29 = ValidationState_t::FindDef(_,uVar22);
        if ((pIVar29 != (Instruction *)0x0) && ((pIVar29->inst_).opcode != 0x13)) goto LAB_0058e928;
        ValidationState_t::diag
                  ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        std::operator<<((ostream *)&errorVUID,"OpStore Pointer <id> ");
LAB_0058e90c:
        ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar16);
        std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
        pcVar27 = "s type is void.";
      }
      else {
        if (uVar4 != 0x1141) goto LAB_0058e309;
        pIVar29 = (Instruction *)0x0;
LAB_0058e928:
        bVar14 = ValidationState_t::GetPointerTypeInfo
                           (_,(pIVar31->inst_).result_id,(uint32_t *)&opcode_name,
                            (StorageClass *)&stride_value);
        if (bVar14) {
          if ((stride_value._0_4_ < 10) && ((0x203U >> (stride_value._0_4_ & 0x1f) & 1) != 0)) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            std::operator<<((ostream *)&errorVUID,"OpStore Pointer <id> ");
            ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar16);
            std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
            pcVar27 = " storage class is read-only";
          }
          else {
            if (stride_value._0_4_ == 0x14db) {
              ValidationState_t::VkErrorID_abi_cxx11_(&errorVUID,_,0x125f,(char *)0x0);
              pFVar32 = ValidationState_t::function
                                  (_,*(uint32_t *)
                                      &(((inst->dbg_line_insts_).
                                         super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                                       _vptr_IntrusiveNodeBase);
              std::__cxx11::string::string((string *)&instr_name,(string *)&errorVUID);
              ValidateType.inst = (Instruction **)0x0;
              ValidateType._ = (ValidationState_t *)::operator_new(0x20);
              (ValidateType._)->context_ = (spv_const_context)&(ValidateType._)->words_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)instr_name._M_dataplus._M_p == &instr_name.field_2) {
                (ValidateType._)->words_ =
                     (uint32_t *)
                     CONCAT71(instr_name.field_2._M_allocated_capacity._1_7_,
                              instr_name.field_2._M_local_buf[0]);
                (ValidateType._)->num_words_ = instr_name.field_2._8_8_;
              }
              else {
                (ValidateType._)->context_ = (spv_const_context)instr_name._M_dataplus._M_p;
                (ValidateType._)->words_ =
                     (uint32_t *)
                     CONCAT71(instr_name.field_2._M_allocated_capacity._1_7_,
                              instr_name.field_2._M_local_buf[0]);
              }
              (ValidateType._)->options_ = (spv_const_validator_options)instr_name._M_string_length;
              instr_name._M_string_length = 0;
              instr_name.field_2._M_local_buf[0] = '\0';
              ValidateType.instr_name =
                   (string *)
                   std::
                   _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_memory.cpp:1057:15)>
                   ::_M_manager;
              instr_name._M_dataplus._M_p = (pointer)&instr_name.field_2;
              std::__cxx11::
              list<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
              ::push_back(&pFVar32->execution_model_limitations_,(value_type *)&ValidateType);
              if (ValidateType.instr_name != (string *)0x0) {
                (*(code *)ValidateType.instr_name)(&ValidateType,&ValidateType,3);
              }
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
            else if (stride_value._0_4_ == 0x14df) {
              ValidationState_t::diag
                        ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
              pcVar27 = "ShaderRecordBufferKHR Storage Class variables are read only";
              goto LAB_0058e468;
            }
            bVar14 = spvIsVulkanEnv(_->context_->target_env);
            if (((bVar14) && (stride_value._0_4_ == 2)) &&
               (pIVar28 = ValidationState_t::TracePointer(_,pIVar28),
               (pIVar28->inst_).opcode == 0x3b)) {
              uVar22 = Instruction::GetOperandAs<unsigned_int>(pIVar28,0);
              pIVar28 = ValidationState_t::FindDef(_,uVar22);
              uVar22 = Instruction::GetOperandAs<unsigned_int>(pIVar28,2);
              pIVar28 = ValidationState_t::FindDef(_,uVar22);
              if (((pIVar28->inst_).opcode & 0xfffe) == 0x1c) {
                uVar22 = Instruction::GetOperandAs<unsigned_int>(pIVar28,1);
                pIVar28 = ValidationState_t::FindDef(_,uVar22);
              }
              bVar14 = ValidationState_t::HasDecoration(_,(pIVar28->inst_).result_id,Block);
              if (bVar14) {
                ValidationState_t::diag
                          ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst
                          );
                ValidationState_t::VkErrorID_abi_cxx11_(&instr_name,_,0x1b0d,(char *)0x0);
                std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
                pcVar27 = "In the Vulkan environment, cannot store to Uniform Blocks";
                goto LAB_0058ed4c;
              }
            }
            uVar22 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,1);
            pIVar28 = ValidationState_t::FindDef(_,uVar22);
            if ((pIVar28 != (Instruction *)0x0) && (uVar20 = (pIVar28->inst_).type_id, uVar20 != 0))
            {
              pIVar31 = ValidationState_t::FindDef(_,uVar20);
              if ((pIVar31 == (Instruction *)0x0) ||
                 (uVar4 = (pIVar31->inst_).opcode, uVar4 == 0x13)) {
                ValidationState_t::diag
                          ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst
                          );
                std::operator<<((ostream *)&errorVUID,"OpStore Object <id> ");
                uVar16 = uVar22;
                goto LAB_0058e90c;
              }
              if ((pIVar29 != (Instruction *)0x0) &&
                 ((pIVar29->inst_).result_id != (pIVar31->inst_).result_id)) {
                if ((_->options_->relax_struct_store != true) ||
                   ((uVar4 != 0x1e || ((pIVar29->inst_).opcode != 0x1e)))) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,
                             (Instruction *)inst);
                  std::operator<<((ostream *)&errorVUID,"OpStore Pointer <id> ");
                  ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar16);
                  std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
                  std::operator<<((ostream *)&errorVUID,"s type does not match Object <id> ");
                  uVar20 = (pIVar28->inst_).result_id;
                  __return_storage_ptr__ = (string *)&opcode_name;
                  goto LAB_0058f211;
                }
                bVar14 = anon_unknown_2::AreLayoutCompatibleStructs
                                   (_,(Instruction *)pIVar29,(Instruction *)pIVar31);
                if (!bVar14) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,
                             (Instruction *)inst);
                  std::operator<<((ostream *)&errorVUID,"OpStore Pointer <id> ");
                  ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar16);
                  std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
                  std::operator<<((ostream *)&errorVUID,"s layout does not match Object <id> ");
                  ValidationState_t::getIdName_abi_cxx11_
                            ((string *)&opcode_name,_,(pIVar28->inst_).result_id);
                  std::operator<<((ostream *)&errorVUID,(string *)&opcode_name);
                  pcVar27 = "s layout.";
                  goto LAB_0058f2f7;
                }
              }
              sVar21 = anon_unknown_2::CheckMemoryAccess(_,inst,2);
              if (sVar21 != SPV_SUCCESS) {
                return sVar21;
              }
              bVar14 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader)
              ;
              if (((bVar14) &&
                  (bVar14 = ValidationState_t::ContainsLimitedUseIntOrFloatType
                                      (_,*(uint32_t *)
                                          &(inst->operands_).
                                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                           ._M_impl.super__Vector_impl_data._M_finish), bVar14)) &&
                 ((uVar39 = (ulong)(pIVar31->inst_).opcode, 0x20 < uVar39 ||
                  ((0x101e00000U >> (uVar39 & 0x3f) & 1) == 0)))) {
                ValidationState_t::diag
                          ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst
                          );
                pcVar27 = "8- or 16-bit stores must be a scalar, vector or matrix type";
                goto LAB_0058e468;
              }
              bVar14 = spvIsVulkanEnv(_->context_->target_env);
              if ((bVar14) && (_->options_->before_hlsl_legalization == false)) {
                errorVUID._M_dataplus._M_p = (pointer)0x0;
                errorVUID._M_string_length = 0;
                errorVUID.field_2._8_8_ =
                     std::
                     _Function_handler<bool_(const_spvtools::val::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_memory.cpp:1143:34)>
                     ::_M_invoke;
                errorVUID.field_2._M_allocated_capacity =
                     (size_type)
                     std::
                     _Function_handler<bool_(const_spvtools::val::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_memory.cpp:1143:34)>
                     ::_M_manager;
                bVar14 = ValidationState_t::ContainsType
                                   (_,(pIVar31->inst_).result_id,
                                    (function<bool_(const_spvtools::val::Instruction_*)>_conflict *)
                                    &errorVUID,true);
                if (errorVUID.field_2._M_allocated_capacity != 0) {
                  (*(code *)errorVUID.field_2._M_allocated_capacity)(&errorVUID,&errorVUID,3);
                }
                if (bVar14) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,
                             (Instruction *)inst);
                  ValidationState_t::VkErrorID_abi_cxx11_(&instr_name,_,0x1b0c,(char *)0x0);
                  std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
                  pcVar27 = 
                  "Cannot store to OpTypeImage, OpTypeSampler, OpTypeSampledImage, or OpTypeAccelerationStructureKHR objects"
                  ;
                  goto LAB_0058ed4c;
                }
              }
              goto switchD_0058d24a_caseD_14f1;
            }
            ValidationState_t::diag
                      ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            std::operator<<((ostream *)&errorVUID,"OpStore Object <id> ");
            ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar22);
            std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
            pcVar27 = " is not an object.";
          }
        }
        else {
          ValidationState_t::diag
                    ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          std::operator<<((ostream *)&errorVUID,"OpStore Pointer <id> ");
          ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar16);
          std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
          pcVar27 = " is not pointer type";
        }
      }
      goto LAB_0058ed4c;
    }
LAB_0058e309:
    ValidationState_t::diag
              ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
    std::operator<<((ostream *)&errorVUID,"OpStore type for pointer <id> ");
    goto LAB_0058e33e;
  case 0x3f:
  case 0x40:
    uVar20 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,0);
    pIVar28 = ValidationState_t::FindDef(_,uVar20);
    if (pIVar28 == (Instruction *)0x0) {
      ValidationState_t::diag
                ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::operator<<((ostream *)&errorVUID,"Target operand <id> ");
LAB_0058e2a8:
      ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar20);
      std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
      pcVar27 = " is not defined.";
      goto LAB_0058ed4c;
    }
    uVar16 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,1);
    pIVar31 = ValidationState_t::FindDef(_,uVar16);
    if (pIVar31 == (Instruction *)0x0) {
      ValidationState_t::diag
                ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      pcVar27 = "Source operand <id> ";
      uVar20 = uVar16;
LAB_0058e122:
      std::operator<<((ostream *)&errorVUID,pcVar27);
      goto LAB_0058e2a8;
    }
    pIVar28 = ValidationState_t::FindDef(_,(pIVar28->inst_).type_id);
    if ((pIVar28 == (Instruction *)0x0) ||
       ((uVar4 = (pIVar28->inst_).opcode, uVar4 != 0x20 && (uVar4 != 0x1141)))) {
      ValidationState_t::diag
                ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::operator<<((ostream *)&errorVUID,"Target operand <id> ");
LAB_0058e68a:
      ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar20);
      std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
      pcVar27 = " is not a pointer.";
      goto LAB_0058ed4c;
    }
    pIVar31 = ValidationState_t::FindDef(_,(pIVar31->inst_).type_id);
    if ((pIVar31 == (Instruction *)0x0) ||
       ((uVar4 = (pIVar31->inst_).opcode, uVar4 != 0x20 && (uVar4 != 0x1141)))) {
      ValidationState_t::diag
                ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::operator<<((ostream *)&errorVUID,"Source operand <id> ");
      uVar20 = uVar16;
      goto LAB_0058e68a;
    }
    if (*(short *)((long)&(inst->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_start + 2) == 0x3f) {
      if ((pIVar28->inst_).opcode == 0x20) {
        uVar22 = Instruction::GetOperandAs<unsigned_int>(pIVar28,2);
        pIVar29 = ValidationState_t::FindDef(_,uVar22);
        if ((pIVar29 != (Instruction *)0x0) && ((pIVar29->inst_).opcode != 0x13)) {
          if (uVar4 == 0x20) goto LAB_0058fa28;
LAB_0058fd55:
          uVar20 = 2;
LAB_00590788:
          sVar21 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar20);
          if (sVar21 != SPV_SUCCESS) {
            return sVar21;
          }
          uVar2 = *(ushort *)
                   ((long)&(inst->operands_).
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_start + 2);
          if (1 < uVar2 - 0x3f) {
            __assert_fail("inst->opcode() == spv::Op::OpCopyMemory || inst->opcode() == spv::Op::OpCopyMemorySized"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_memory.cpp"
                          ,0x48c,
                          "spv_result_t spvtools::val::(anonymous namespace)::ValidateCopyMemoryMemoryAccess(ValidationState_t &, const Instruction *)"
                         );
          }
          uVar16 = uVar2 == 0x3f ^ 3;
          if ((ulong)uVar16 <
              (ulong)((long)inst->context_ -
                      *(long *)&(inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                                is_sentinel_ >> 4)) {
            sVar21 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar16);
            if (sVar21 != SPV_SUCCESS) {
              return sVar21;
            }
            uVar22 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,(ulong)uVar16);
            iVar23 = anon_unknown_2::MemoryAccessNumWords(uVar22);
            uVar16 = iVar23 + uVar16;
            if ((ulong)uVar16 <
                (ulong)((long)inst->context_ -
                        *(long *)&(inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                                  is_sentinel_ >> 4)) {
              if ((_->features_).copy_memory_permits_two_memory_accesses == true) {
                sVar21 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar16);
                if (sVar21 != SPV_SUCCESS) {
                  return sVar21;
                }
                if ((uVar22 & 0x10) == 0) {
                  uVar16 = Instruction::GetOperandAs<unsigned_int>
                                     ((Instruction *)inst,(ulong)uVar16);
                  if ((uVar16 & 8) == 0) goto LAB_0059095b;
                  ValidationState_t::diag
                            ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,
                             (Instruction *)inst);
                  pcVar27 = "Source memory access must not include MakePointerAvailableKHR";
                }
                else {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,
                             (Instruction *)inst);
                  pcVar27 = "Target memory access must not include MakePointerVisibleKHR";
                }
              }
              else {
                ValidationState_t::diag
                          ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,
                           (Instruction *)inst);
                pcVar27 = spvOpcodeString((uint)*(ushort *)
                                                 ((long)&(inst->operands_).
                                                                                                                  
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 2));
                std::operator<<((ostream *)&errorVUID,pcVar27);
                pcVar27 = " with two memory access operands requires SPIR-V 1.4 or later";
              }
              std::operator<<((ostream *)&errorVUID,pcVar27);
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&errorVUID);
              if (local_48 != SPV_SUCCESS) {
                return local_48;
              }
            }
          }
LAB_0059095b:
          if ((pIVar28->inst_).opcode == 0x20) {
            do {
              uVar16 = Instruction::GetOperandAs<unsigned_int>(pIVar28,2);
              pIVar28 = ValidationState_t::FindDef(_,uVar16);
            } while ((pIVar28->inst_).opcode == 0x20);
            bVar14 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
            if ((bVar14) &&
               (bVar14 = ValidationState_t::ContainsLimitedUseIntOrFloatType
                                   (_,(pIVar28->inst_).result_id), bVar14)) {
              ValidationState_t::diag
                        ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
              pcVar27 = "Cannot copy memory of objects containing 8- or 16-bit types";
              goto LAB_0058e468;
            }
          }
          goto switchD_0058d24a_caseD_14f1;
        }
        ValidationState_t::diag
                  ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        std::operator<<((ostream *)&errorVUID,"Target operand <id> ");
        uVar16 = uVar20;
      }
      else {
        if (uVar4 != 0x20) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          pcVar27 = "One of Source or Target must be a typed pointer";
          goto LAB_0058e468;
        }
        pIVar29 = (Instruction *)0x0;
LAB_0058fa28:
        uVar22 = Instruction::GetOperandAs<unsigned_int>(pIVar31,2);
        pIVar31 = ValidationState_t::FindDef(_,uVar22);
        if ((pIVar31 != (Instruction *)0x0) && ((pIVar31->inst_).opcode != 0x13)) {
          if ((pIVar29 == (Instruction *)0x0) ||
             ((pIVar29->inst_).result_id == (pIVar31->inst_).result_id)) goto LAB_0058fd55;
          ValidationState_t::diag
                    ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          std::operator<<((ostream *)&errorVUID,"Target <id> ");
          ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar16);
          std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
          std::operator<<((ostream *)&errorVUID,"s type does not match Source <id> ");
          uVar20 = (pIVar31->inst_).result_id;
          goto LAB_0058f20c;
        }
        ValidationState_t::diag
                  ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        std::operator<<((ostream *)&errorVUID,"Source operand <id> ");
      }
      ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar16);
      std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
      pcVar27 = " cannot be a void pointer.";
      goto LAB_0058ed4c;
    }
    uVar20 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,2);
    pIVar29 = ValidationState_t::FindDef(_,uVar20);
    if (pIVar29 == (Instruction *)0x0) {
      ValidationState_t::diag
                ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      pcVar27 = "Size operand <id> ";
      goto LAB_0058e122;
    }
    pIVar30 = ValidationState_t::FindDef(_,(pIVar29->inst_).type_id);
    bVar14 = ValidationState_t::IsIntScalarType(_,(pIVar30->inst_).result_id);
    if (bVar14) {
      uVar4 = (pIVar29->inst_).opcode;
      if (uVar4 == 0x2b) {
        if (((pIVar30->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start[3] != 1) ||
           (-1 < (int)(pIVar29->words_).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1])) {
          uVar39 = 3;
          bVar14 = true;
          while (bVar14) {
            puVar5 = (pIVar29->words_).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((ulong)((long)(pIVar29->words_).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 2) <=
                uVar39) goto LAB_0058efb0;
            bVar14 = puVar5[uVar39] == 0;
            uVar39 = uVar39 + 1;
          }
          goto LAB_0058fbc5;
        }
        ValidationState_t::diag
                  ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        std::operator<<((ostream *)&errorVUID,"Size operand <id> ");
        ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar20);
        std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
        pcVar27 = " cannot have the sign bit set to 1.";
      }
      else {
        if (uVar4 != 0x2e) {
LAB_0058fbc5:
          pCVar1 = &_->module_capabilities_;
          bVar14 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityShader);
          if (bVar14) {
            ValidationState_t::EvalInt32IfConst
                      ((tuple<bool,_bool,_unsigned_int> *)&errorVUID,_,uVar20);
            _Var6 = errorVUID._M_dataplus;
            if ((((ulong)errorVUID._M_dataplus._M_p & 3) != 0 & errorVUID._M_dataplus._M_p._4_1_) ==
                1) {
              SVar15 = Instruction::GetOperandAs<spv::StorageClass>(pIVar31,1);
              local_230 = CONCAT44(extraout_var,SVar15);
              SVar15 = Instruction::GetOperandAs<spv::StorageClass>(pIVar28,1);
              bVar14 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityInt8);
              local_268 = (Instruction *)CONCAT71(local_268._1_7_,bVar14);
              bVar14 = EnumSet<spv::Capability>::contains
                                 (pCVar1,CapabilityUniformAndStorageBuffer8BitAccess);
              bVar7 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityStorageBuffer8BitAccess);
              bVar7 = bVar7 || bVar14;
              bVar9 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityStoragePushConstant8);
              bVar10 = EnumSet<spv::Capability>::contains
                                 (pCVar1,CapabilityWorkgroupMemoryExplicitLayout8BitAccessKHR);
              local_258 = CONCAT71(local_258._1_7_,bVar10);
              bVar10 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityInt16);
              bVar11 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityStorageUniform16);
              local_260 = CONCAT71(local_260._1_7_,bVar14 || bVar11);
              bVar12 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityStorageBuffer16BitAccess)
              ;
              bVar35 = (bVar12 || bVar11) || bVar7;
              bVar11 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityStoragePushConstant16);
              bVar12 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityStorageInputOutput16);
              bVar13 = EnumSet<spv::Capability>::contains
                                 (pCVar1,CapabilityWorkgroupMemoryExplicitLayout16BitAccessKHR);
              bVar8 = 0;
              bVar34 = 0;
              switch((int)local_230) {
              case 1:
              case 3:
                bVar8 = bVar12;
                bVar34 = 0;
                break;
              case 2:
                bVar8 = (byte)local_260;
                bVar34 = bVar14;
                break;
              case 4:
                bVar8 = bVar13;
                bVar34 = (byte)local_258;
                break;
              case 5:
              case 6:
              case 7:
              case 8:
              case 10:
              case 0xb:
                break;
              case 9:
                bVar8 = bVar11 || bVar9;
                bVar34 = bVar9;
                break;
              case 0xc:
                bVar8 = bVar35;
                bVar34 = bVar7;
                break;
              default:
                bVar34 = 0;
              }
              bVar38 = 0;
              bVar36 = 0;
              switch(SVar15) {
              case StorageClassUniform:
                bVar38 = bVar14;
                bVar36 = (byte)local_260;
                break;
              case Output:
                bVar38 = 0;
                bVar36 = bVar12;
                break;
              case StorageClassWorkgroup:
                bVar38 = (byte)local_258;
                bVar36 = bVar13;
                break;
              case CrossWorkgroup:
              case Private:
              case Function:
              case Generic:
              case AtomicCounter:
              case Image:
                break;
              case PushConstant:
                bVar38 = bVar9;
                bVar36 = bVar11 || bVar9;
                break;
              case StorageBuffer:
                bVar38 = bVar7;
                bVar36 = bVar35;
                break;
              default:
                bVar38 = 0;
                bVar36 = 0;
              }
              if ((bVar10 || (bVar8 & bVar36) != 0) || (char)local_268 != '\0') {
                if (((char)local_268 != '\0' || (bVar34 & bVar38) != 0) ||
                    ((ulong)_Var6._M_p & 1) == 0) goto LAB_00590786;
                ValidationState_t::diag
                          ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst
                          );
                pcVar27 = "Size must be a multiple of 2";
              }
              else {
                ValidationState_t::diag
                          ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst
                          );
                pcVar27 = "Size must be a multiple of 4";
              }
              goto LAB_0058e468;
            }
          }
LAB_00590786:
          uVar20 = 3;
          goto LAB_00590788;
        }
LAB_0058efb0:
        ValidationState_t::diag
                  ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        std::operator<<((ostream *)&errorVUID,"Size operand <id> ");
        ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar20);
        std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
        pcVar27 = " cannot be a constant zero.";
      }
      goto LAB_0058ed4c;
    }
    ValidationState_t::diag
              ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
    std::operator<<((ostream *)&errorVUID,"Size operand <id> ");
    goto LAB_0058f767;
  case 0x41:
  case 0x42:
  case 0x46:
switchD_0058cd54_caseD_1143:
    sVar21 = anon_unknown_2::ValidateAccessChain(_,inst);
    break;
  case 0x43:
switchD_0058cd54_caseD_1147:
    AVar18 = ValidationState_t::addressing_model(_);
    if (((AVar18 != AddressingModelLogical) ||
        (*(short *)((long)&(inst->operands_).
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_start + 2) != 0x43)) ||
       ((_->features_).variable_pointers != false)) {
      sVar21 = anon_unknown_2::ValidateAccessChain(_,inst);
      if (sVar21 != SPV_SUCCESS) {
        return sVar21;
      }
      bVar14 = spvOpcodeGeneratesUntypedPointer
                         ((uint)*(ushort *)
                                 ((long)&(inst->operands_).
                                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 2));
      uVar16 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,2);
      pIVar28 = ValidationState_t::FindDef(_,uVar16);
      if (bVar14) {
        uVar20 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,2);
      }
      else {
        uVar20 = (pIVar28->inst_).type_id;
      }
      pIVar28 = ValidationState_t::FindDef(_,uVar20);
      SVar15 = Instruction::GetOperandAs<spv::StorageClass>(pIVar28,1);
      pCVar1 = &_->module_capabilities_;
      bVar7 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityShader);
      if ((bVar7) &&
         ((((SVar15 < (StorageBuffer|Input) && ((0x1204U >> (SVar15 & 0x1f) & 1) != 0)) ||
           ((SVar15 == PhysicalStorageBuffer ||
            ((bVar7 = EnumSet<spv::Capability>::contains
                                (pCVar1,CapabilityWorkgroupMemoryExplicitLayoutKHR),
             SVar15 == StorageClassWorkgroup && (bVar7)))))) &&
          (bVar7 = ValidationState_t::HasDecoration(_,(pIVar28->inst_).result_id,ArrayStride),
          !bVar7)))) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,(Instruction *)inst);
        pcVar27 = "OpPtrAccessChain must have a Base whose type is decorated with ArrayStride";
        goto LAB_0058e468;
      }
      bVar7 = spvIsVulkanEnv(_->context_->target_env);
      if (!bVar7) goto switchD_0058d24a_caseD_14f1;
      if (bVar14) {
        bVar14 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityUntypedPointersKHR);
      }
      else {
        bVar14 = false;
      }
      if (SVar15 == PhysicalStorageBuffer) goto switchD_0058d24a_caseD_14f1;
      if (SVar15 == StorageBuffer) {
        if (bVar14 == false && (_->features_).variable_pointers == false) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,(Instruction *)inst);
          ValidationState_t::VkErrorID_abi_cxx11_(&instr_name,_,0x1de4,(char *)0x0);
          std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
          pcVar27 = 
          "OpPtrAccessChain Base operand pointing to StorageBuffer storage class must use VariablePointers or VariablePointersStorageBuffer capability"
          ;
          goto LAB_0058ed4c;
        }
        goto switchD_0058d24a_caseD_14f1;
      }
      if (SVar15 != StorageClassWorkgroup) {
        if (bVar14 == false) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,(Instruction *)inst);
          ValidationState_t::VkErrorID_abi_cxx11_(&instr_name,_,0x1de2,(char *)0x0);
          std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
          pcVar27 = 
          "OpPtrAccessChain Base operand must point to Workgroup, StorageBuffer, or PhysicalStorageBuffer storage class"
          ;
          goto LAB_0058ed4c;
        }
        goto switchD_0058d24a_caseD_14f1;
      }
      bVar7 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityVariablePointers);
      if (bVar14 != false || bVar7) goto switchD_0058d24a_caseD_14f1;
      ValidationState_t::diag
                ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,(Instruction *)inst);
      ValidationState_t::VkErrorID_abi_cxx11_(&instr_name,_,0x1de3,(char *)0x0);
      std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
      pcVar27 = 
      "OpPtrAccessChain Base operand pointing to Workgroup storage class must use VariablePointers capability"
      ;
      goto LAB_0058ed4c;
    }
    ValidationState_t::diag
              ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,(Instruction *)inst);
    std::operator<<((ostream *)&errorVUID,"Generating variable pointers requires capability ");
    pcVar27 = "VariablePointers or VariablePointersStorageBuffer";
    goto LAB_0058e468;
  case 0x44:
switchD_0058cd54_caseD_1149:
    pcVar27 = spvOpcodeString(opcode);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&errorVUID,pcVar27,(allocator<char> *)&ValidateType);
    std::operator+(&instr_name,"Op",&errorVUID);
    std::__cxx11::string::_M_dispose();
    pIVar28 = ValidationState_t::FindDef
                        (_,*(uint32_t *)
                            &(inst->operands_).
                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
    if ((((pIVar28->inst_).opcode != 0x15) ||
        (uVar16 = Instruction::GetOperandAs<unsigned_int>(pIVar28,1), uVar16 != 0x20)) ||
       (uVar16 = Instruction::GetOperandAs<unsigned_int>(pIVar28,2), uVar16 != 0)) {
LAB_0058d4b7:
      ValidationState_t::diag
                ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::operator<<((ostream *)&errorVUID,"The Result Type of ");
      std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
      std::operator<<((ostream *)&errorVUID," <id> ");
      ValidationState_t::getIdName_abi_cxx11_
                ((string *)&ValidateType,_,
                 *(uint32_t *)
                  ((long)&(inst->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 4));
      std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
      pcVar27 = " must be OpTypeInt with width 32 and signedness 0.";
      goto LAB_0058d521;
    }
    sVar33 = *(short *)((long)&(inst->operands_).
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_start + 2);
    uVar20 = ValidationState_t::GetOperandTypeId
                       (_,(Instruction *)inst,(ulong)(sVar33 == 0x1149) | 2);
    pIVar28 = ValidationState_t::FindDef(_,uVar20);
    uVar4 = (pIVar28->inst_).opcode;
    if (sVar33 != 0x1149) {
      if (uVar4 == 0x20) goto LAB_0058eb9e;
LAB_0058ec82:
      ValidationState_t::diag
                ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::operator<<((ostream *)&errorVUID,"The Structure\'s type in ");
      std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
      std::operator<<((ostream *)&errorVUID," <id> ");
      ValidationState_t::getIdName_abi_cxx11_
                ((string *)&ValidateType,_,
                 *(uint32_t *)
                  ((long)&(inst->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 4));
      std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
      pcVar27 = " must be a pointer to an OpTypeStruct.";
      goto LAB_0058d521;
    }
    pIVar28 = (Instruction *)inst;
    if (uVar4 == 0x1141) {
LAB_0058eb9e:
      uVar16 = Instruction::GetOperandAs<unsigned_int>(pIVar28,2);
      pIVar28 = ValidationState_t::FindDef(_,uVar16);
      if ((pIVar28->inst_).opcode != 0x1e) goto LAB_0058ec82;
      lVar40 = (long)(pIVar28->operands_).
                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pIVar28->operands_).
                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4;
      uVar16 = Instruction::GetOperandAs<unsigned_int>(pIVar28,lVar40 - 1);
      pIVar28 = ValidationState_t::FindDef(_,uVar16);
      if ((pIVar28->inst_).opcode != 0x1d) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        std::operator<<((ostream *)&errorVUID,"The Structure\'s last member in ");
        std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
        std::operator<<((ostream *)&errorVUID," <id> ");
        ValidationState_t::getIdName_abi_cxx11_
                  ((string *)&ValidateType,_,
                   *(uint32_t *)
                    ((long)&(inst->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_finish + 4));
        std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
        pcVar27 = " must be an OpTypeRuntimeArray.";
LAB_0058d521:
        std::operator<<((ostream *)&errorVUID,pcVar27);
LAB_0058d529:
        std::__cxx11::string::_M_dispose();
        goto LAB_0058d53b;
      }
      uVar16 = Instruction::GetOperandAs<unsigned_int>
                         ((Instruction *)inst,(ulong)(sVar33 == 0x1149) + 3);
      sVar21 = SPV_SUCCESS;
      if (lVar40 - 2U != (ulong)uVar16) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        std::operator<<((ostream *)&errorVUID,"The array member in ");
        std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
        std::operator<<((ostream *)&errorVUID," <id> ");
        ValidationState_t::getIdName_abi_cxx11_
                  ((string *)&ValidateType,_,
                   *(uint32_t *)
                    ((long)&(inst->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_finish + 4));
        std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
        pcVar27 = " must be the last member of the struct.";
        goto LAB_0058d521;
      }
    }
    else {
      ValidationState_t::diag
                ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::operator<<((ostream *)&errorVUID,"Pointer must be an untyped pointer");
LAB_0058d53b:
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&errorVUID);
      sVar21 = local_48;
    }
LAB_0058d540:
    local_48 = sVar21;
    std::__cxx11::string::_M_dispose();
    goto LAB_0058ed6b;
  default:
    switch(uVar2) {
    case 0x1142:
      goto switchD_0058cd54_caseD_1142;
    case 0x1143:
    case 0x1144:
      goto switchD_0058cd54_caseD_1143;
    case 0x1145:
    case 0x1146:
      goto switchD_0058d24a_caseD_14f1;
    case 0x1147:
    case 0x1148:
      goto switchD_0058cd54_caseD_1147;
    case 0x1149:
      goto switchD_0058cd54_caseD_1149;
    }
    switch(uVar2) {
    case 0x14a9:
    case 0x14ac:
      bVar14 = opcode == OpCooperativeVectorMatrixMulAddNV;
      uVar39 = (ulong)bVar14;
      pcVar27 = "spv::Op::OpCooperativeVectorMatrixMulNV";
      if (bVar14) {
        pcVar27 = "spv::Op::OpCooperativeVectorMatrixMulAddNV";
      }
      sVar37 = uVar39 * 3 + 7;
      index = uVar39 * 3 + 8;
      index_00 = uVar39 * 3 + 9;
      ValidateType._ = (ValidationState_t *)inst;
      opcode_name = pcVar27;
      uVar16 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,0);
      local_268 = (Instruction *)CONCAT44(local_268._4_4_,uVar16);
      uVar16 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,2);
      local_230 = CONCAT44(local_230._4_4_,uVar16);
      uVar16 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,3);
      uVar22 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,6);
      uVar26 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,9);
      local_258 = sVar37;
      id_00 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,sVar37);
      local_260 = index;
      id_01 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,index);
      id_02 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,index_00);
      id_03 = Instruction::GetOperandAs<unsigned_int>
                        ((Instruction *)inst,(ulong)((uint)bVar14 * 3 + 10));
      sVar21 = anon_unknown_2::ValidateCooperativeVectorPointer(_,inst,pcVar27,4);
      if (sVar21 != SPV_SUCCESS) {
        return sVar21;
      }
      if ((*(short *)((long)&(inst->operands_).
                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                             ._M_impl.super__Vector_impl_data._M_start + 2) == 0x14ac) &&
         (sVar21 = anon_unknown_2::ValidateCooperativeVectorPointer(_,inst,pcVar27,7),
         sVar21 != SPV_SUCCESS)) {
        return sVar21;
      }
      uVar20 = (uint32_t)local_268;
      pIVar28 = ValidationState_t::FindDef(_,(uint32_t)local_268);
      if ((pIVar28->inst_).opcode != 0x14a8) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        std::operator<<((ostream *)&errorVUID,pcVar27);
        std::operator<<((ostream *)&errorVUID," result type <id> ");
        goto LAB_0058ed35;
      }
      uVar17 = Instruction::GetOperandAs<unsigned_int>(pIVar28,1);
      bVar14 = ValidationState_t::IsIntScalarType(_,uVar17);
      if (((!bVar14) || (uVar20 = ValidationState_t::GetBitWidth(_,uVar17), uVar20 != 0x20)) &&
         ((bVar14 = ValidationState_t::IsFloatScalarType(_,uVar17), !bVar14 ||
          ((uVar20 = ValidationState_t::GetBitWidth(_,uVar17), uVar20 != 0x20 &&
           (uVar20 = ValidationState_t::GetBitWidth(_,uVar17), uVar20 != 0x10)))))) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        std::operator<<((ostream *)&errorVUID,pcVar27);
        std::operator<<((ostream *)&errorVUID," result component type <id> ");
        ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar17);
        std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
        pcVar27 = " is not a 32 bit int or 16/32 bit float.";
        goto LAB_0058ed4c;
      }
      ValidationState_t::EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)&stride_value,_,id_00);
      uVar17 = Instruction::GetOperandAs<unsigned_int>(pIVar28,2);
      ValidationState_t::EvalInt32IfConst(&rc_eval,_,uVar17);
      if (((stride_value._4_1_ != '\x01') ||
          (rc_eval.super__Tuple_impl<0UL,_bool,_bool,_unsigned_int>.
           super__Tuple_impl<1UL,_bool,_unsigned_int>.super__Head_base<1UL,_bool,_false>.
           _M_head_impl != true)) ||
         ((_Head_base<2UL,_unsigned_int,_false>)stride_value._0_4_ ==
          rc_eval.super__Tuple_impl<0UL,_bool,_bool,_unsigned_int>.
          super__Tuple_impl<1UL,_bool,_unsigned_int>.super__Tuple_impl<2UL,_unsigned_int>.
          super__Head_base<2UL,_unsigned_int,_false>._M_head_impl)) {
        ValidationState_t::EvalInt32IfConst(&k_eval,_,id_01);
        pIVar28 = ValidationState_t::FindDef(_,(uint32_t)local_230);
        pIVar28 = ValidationState_t::FindDef(_,(pIVar28->inst_).type_id);
        uVar17 = Instruction::GetOperandAs<unsigned_int>(pIVar28,2);
        ValidationState_t::EvalInt32IfConst(&input_interp_eval,_,uVar16);
        if ((input_interp_eval.super__Tuple_impl<0UL,_bool,_bool,_unsigned_int>.
             super__Tuple_impl<1UL,_bool,_unsigned_int>.super__Head_base<1UL,_bool,_false>.
             _M_head_impl == true) &&
           (((uint)input_interp_eval.super__Tuple_impl<0UL,_bool,_bool,_unsigned_int>.
                   super__Tuple_impl<1UL,_bool,_unsigned_int>.super__Tuple_impl<2UL,_unsigned_int>.
                   super__Head_base<2UL,_unsigned_int,_false>._M_head_impl & 0xfffffffe) !=
            0x3ba247f8)) {
          ValidationState_t::EvalInt32IfConst
                    ((tuple<bool,_bool,_unsigned_int> *)&instr_name,_,uVar17);
          if ((instr_name._M_dataplus._M_p._4_1_ == '\x01') &&
             ((k_eval.super__Tuple_impl<0UL,_bool,_bool,_unsigned_int>.
               super__Tuple_impl<1UL,_bool,_unsigned_int>.super__Head_base<1UL,_bool,_false>.
               _M_head_impl == true &&
              ((_Head_base<2UL,_unsigned_int,_false>)instr_name._M_dataplus._M_p._0_4_ !=
               k_eval.super__Tuple_impl<0UL,_bool,_bool,_unsigned_int>.
               super__Tuple_impl<1UL,_bool,_unsigned_int>.super__Tuple_impl<2UL,_unsigned_int>.
               super__Head_base<2UL,_unsigned_int,_false>._M_head_impl)))) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            std::operator<<((ostream *)&errorVUID,pcVar27);
            std::operator<<((ostream *)&errorVUID," input number of components ");
            std::ostream::_M_insert<unsigned_long>((ulong)&errorVUID);
            std::operator<<((ostream *)&errorVUID," does not match K ");
            goto LAB_0058f8d0;
          }
        }
        pIVar28 = ValidationState_t::FindDef(_,id_03);
        bVar14 = ValidationState_t::IsBoolScalarType(_,(pIVar28->inst_).type_id);
        if (bVar14) {
          errorVUID._M_string_length = (size_type)&ValidateType;
          errorVUID.field_2._M_allocated_capacity = (size_type)&opcode_name;
          errorVUID._M_dataplus._M_p = (pointer)_;
          local_48 = anon_unknown_2::ValidateCooperativeVectorMatrixMulNV::anon_class_24_3_28eea47e
                     ::operator()((anon_class_24_3_28eea47e *)&errorVUID,uVar16,
                                  "InputInterpretation");
          if ((((((local_48 == SPV_SUCCESS) &&
                 (local_48 = anon_unknown_2::ValidateCooperativeVectorMatrixMulNV::
                             anon_class_24_3_28eea47e::operator()
                                       ((anon_class_24_3_28eea47e *)&errorVUID,uVar22,
                                        "MatrixInterpretation"), local_48 == SPV_SUCCESS)) &&
                ((uVar2 != 0x14ac ||
                 (local_48 = anon_unknown_2::ValidateCooperativeVectorMatrixMulNV::
                             anon_class_24_3_28eea47e::operator()
                                       ((anon_class_24_3_28eea47e *)&errorVUID,uVar26,
                                        "BiasInterpretation"), local_48 == SPV_SUCCESS)))) &&
               ((((((local_48 = anon_unknown_2::ValidateCooperativeVectorMatrixMulNV::
                                anon_class_24_3_28eea47e::operator()
                                          ((anon_class_24_3_28eea47e *)&errorVUID,id_00,"M"),
                    local_48 == SPV_SUCCESS &&
                    (local_48 = anon_unknown_2::ValidateCooperativeVectorMatrixMulNV::
                                anon_class_24_3_28eea47e::operator()
                                          ((anon_class_24_3_28eea47e *)&errorVUID,id_01,"K"),
                    local_48 == SPV_SUCCESS)) &&
                   (local_48 = anon_unknown_2::ValidateCooperativeVectorMatrixMulNV::
                               anon_class_24_3_28eea47e::operator()
                                         ((anon_class_24_3_28eea47e *)&errorVUID,id_02,
                                          "MemoryLayout"), local_48 == SPV_SUCCESS)) &&
                  ((local_48 = anon_unknown_2::ValidateCooperativeVectorMatrixMulNV::
                               anon_class_24_3_28eea47e::operator()
                                         ((anon_class_24_3_28eea47e *)&errorVUID,id_03,"Transpose"),
                   local_48 == SPV_SUCCESS &&
                   (local_48 = anon_unknown_2::ValidateInt32Operand
                                         (_,(Instruction *)ValidateType._,3,opcode_name,
                                          "InputInterpretation"), local_48 == SPV_SUCCESS)))) &&
                 (local_48 = anon_unknown_2::ValidateInt32Operand
                                       (_,(Instruction *)ValidateType._,6,opcode_name,
                                        "MatrixInterpretation"), local_48 == SPV_SUCCESS)) &&
                ((uVar2 != 0x14ac ||
                 (local_48 = anon_unknown_2::ValidateInt32Operand
                                       (_,(Instruction *)ValidateType._,9,opcode_name,
                                        "BiasInterpretation"), local_48 == SPV_SUCCESS)))))) &&
              (local_48 = anon_unknown_2::ValidateInt32Operand
                                    (_,(Instruction *)ValidateType._,(uint32_t)local_258,opcode_name
                                     ,"M"), local_48 == SPV_SUCCESS)) &&
             (local_48 = anon_unknown_2::ValidateInt32Operand
                                   (_,(Instruction *)ValidateType._,(uint32_t)local_260,opcode_name,
                                    "K"), local_48 == SPV_SUCCESS)) {
            operand_name = "MemoryLayout";
            uVar20 = (uint32_t)index_00;
            pcVar27 = opcode_name;
            inst = (Instruction *)ValidateType._;
            goto LAB_0058d7cc;
          }
          goto LAB_0058ed6b;
        }
        ValidationState_t::diag
                  ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        std::operator<<((ostream *)&errorVUID,pcVar27);
        std::operator<<((ostream *)&errorVUID," Transpose <id> ");
        ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,id_03);
        std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
        pcVar27 = " is not a scalar boolean.";
        goto LAB_0058ed4c;
      }
      ValidationState_t::diag
                ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::operator<<((ostream *)&errorVUID,pcVar27);
      std::operator<<((ostream *)&errorVUID," result type number of components ");
      std::ostream::_M_insert<unsigned_long>((ulong)&errorVUID);
      std::operator<<((ostream *)&errorVUID," does not match M ");
LAB_0058f8d0:
      std::ostream::_M_insert<unsigned_long>((ulong)&errorVUID);
      goto LAB_0058ed66;
    case 0x14aa:
      sVar21 = anon_unknown_2::ValidateCooperativeVectorPointer
                         (_,inst,"spv::Op::OpCooperativeVectorOuterProductAccumulateNV",0);
      if (sVar21 != SPV_SUCCESS) {
        return sVar21;
      }
      uVar16 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,2);
      pIVar28 = ValidationState_t::FindDef(_,uVar16);
      uVar20 = (pIVar28->inst_).type_id;
      pIVar28 = ValidationState_t::FindDef(_,uVar20);
      if ((pIVar28->inst_).opcode == 0x14a8) {
        uVar16 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,3);
        pIVar31 = ValidationState_t::FindDef(_,uVar16);
        uVar20 = (pIVar31->inst_).type_id;
        pIVar31 = ValidationState_t::FindDef(_,uVar20);
        if ((pIVar31->inst_).opcode != 0x14a8) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          std::operator<<((ostream *)&errorVUID,
                          "spv::Op::OpCooperativeVectorOuterProductAccumulateNV");
          pcVar27 = " B type <id> ";
          goto LAB_0058ed20;
        }
        uVar16 = Instruction::GetOperandAs<unsigned_int>(pIVar28,1);
        uVar22 = Instruction::GetOperandAs<unsigned_int>(pIVar31,1);
        if (uVar16 != uVar22) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          std::operator<<((ostream *)&errorVUID,
                          "spv::Op::OpCooperativeVectorOuterProductAccumulateNV");
          std::operator<<((ostream *)&errorVUID," A and B component types ");
          ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar16);
          std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
          std::operator<<((ostream *)&errorVUID," and ");
          ValidationState_t::getIdName_abi_cxx11_((string *)&ValidateType,_,uVar22);
          std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
          pcVar27 = " do not match.";
          goto LAB_0058f2f7;
        }
        sVar21 = anon_unknown_2::ValidateInt32Operand
                           (_,inst,1,"spv::Op::OpCooperativeVectorOuterProductAccumulateNV","Offset"
                           );
        if (sVar21 != SPV_SUCCESS) {
          return sVar21;
        }
        sVar21 = anon_unknown_2::ValidateInt32Operand
                           (_,inst,4,"spv::Op::OpCooperativeVectorOuterProductAccumulateNV",
                            "MemoryLayout");
        if (sVar21 != SPV_SUCCESS) {
          return sVar21;
        }
        sVar21 = anon_unknown_2::ValidateInt32Operand
                           (_,inst,5,"spv::Op::OpCooperativeVectorOuterProductAccumulateNV",
                            "MatrixInterpretation");
        if (sVar21 != SPV_SUCCESS) {
          return sVar21;
        }
        if ((ulong)((long)inst->context_ -
                   *(long *)&(inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                             is_sentinel_) < 0x61) goto switchD_0058d24a_caseD_14f1;
        sVar21 = anon_unknown_2::ValidateInt32Operand
                           (_,inst,6,"spv::Op::OpCooperativeVectorOuterProductAccumulateNV",
                            "MatrixStride");
        goto LAB_0058d433;
      }
      ValidationState_t::diag
                ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::operator<<((ostream *)&errorVUID,"spv::Op::OpCooperativeVectorOuterProductAccumulateNV");
      pcVar27 = " A type <id> ";
      goto LAB_0058ed20;
    case 0x14ab:
      sVar21 = anon_unknown_2::ValidateCooperativeVectorPointer
                         (_,inst,"spv::Op::OpCooperativeVectorReduceSumAccumulateNV",0);
      if (sVar21 != SPV_SUCCESS) {
        return sVar21;
      }
      uVar16 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,2);
      pIVar28 = ValidationState_t::FindDef(_,uVar16);
      uVar20 = (pIVar28->inst_).type_id;
      pIVar28 = ValidationState_t::FindDef(_,uVar20);
      if ((pIVar28->inst_).opcode != 0x14a8) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        std::operator<<((ostream *)&errorVUID,"spv::Op::OpCooperativeVectorReduceSumAccumulateNV");
        pcVar27 = " V type <id> ";
        goto LAB_0058ed20;
      }
      pcVar27 = "spv::Op::OpCooperativeVectorReduceSumAccumulateNV";
      operand_name = "Offset";
      uVar20 = 1;
LAB_0058d7cc:
      local_48 = anon_unknown_2::ValidateInt32Operand(_,inst,uVar20,pcVar27,operand_name);
      goto LAB_0058ed6b;
    case 0x14ad:
    case 0x14ae:
    case 0x14af:
    case 0x14b0:
    case 0x14b1:
    case 0x14b2:
    case 0x14b3:
    case 0x14b4:
    case 0x14b5:
      goto switchD_0058d24a_caseD_14f1;
    case 0x14b6:
      pcVar27 = "spv::Op::OpCooperativeVectorLoadNV";
      pIVar28 = (Instruction *)inst;
      break;
    case 0x14b7:
      uVar16 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,2);
      pIVar28 = ValidationState_t::FindDef(_,uVar16);
      pcVar27 = "spv::Op::OpCooperativeVectorStoreNV";
      break;
    default:
      switch(uVar2) {
      case 0x14ef:
        local_2e0 = "spv::Op::OpCooperativeMatrixLoadNV";
        pIVar28 = (Instruction *)inst;
        break;
      case 0x14f0:
        uVar16 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,1);
        pIVar28 = ValidationState_t::FindDef(_,uVar16);
        local_2e0 = "spv::Op::OpCooperativeMatrixStoreNV";
        break;
      case 0x14f1:
      case 0x14f3:
      case 0x14f4:
      case 0x14f5:
      case 0x14f6:
        goto switchD_0058d24a_caseD_14f1;
      case 0x14f2:
switchD_0058d24a_caseD_14f2:
        pcVar27 = spvOpcodeString(opcode);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&errorVUID,pcVar27,(allocator<char> *)&ValidateType);
        std::operator+(&instr_name,"Op",&errorVUID);
        std::__cxx11::string::_M_dispose();
        pIVar28 = ValidationState_t::FindDef
                            (_,*(uint32_t *)
                                &(inst->operands_).
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_finish);
        if ((((pIVar28->inst_).opcode == 0x15) &&
            (uVar16 = Instruction::GetOperandAs<unsigned_int>(pIVar28,1), uVar16 == 0x20)) &&
           (uVar16 = Instruction::GetOperandAs<unsigned_int>(pIVar28,2), uVar16 == 0)) {
          sVar33 = *(short *)((long)&(inst->operands_).
                                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 2);
          uVar16 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,2);
          pIVar28 = ValidationState_t::FindDef(_,uVar16);
          uVar4 = (pIVar28->inst_).opcode;
          if (sVar33 == 0x116c) {
            if (uVar4 == 0x1168) {
LAB_0058ed8f:
              sVar21 = SPV_SUCCESS;
              goto LAB_0058d540;
            }
            ValidationState_t::diag
                      ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            std::operator<<((ostream *)&errorVUID,"The type in ");
            std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
            std::operator<<((ostream *)&errorVUID," <id> ");
            ValidationState_t::getIdName_abi_cxx11_((string *)&ValidateType,_,uVar16);
            std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
            pcVar27 = " must be OpTypeCooperativeMatrixKHR.";
          }
          else {
            if (uVar4 == 0x14ee) goto LAB_0058ed8f;
            ValidationState_t::diag
                      ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            std::operator<<((ostream *)&errorVUID,"The type in ");
            std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
            std::operator<<((ostream *)&errorVUID," <id> ");
            ValidationState_t::getIdName_abi_cxx11_((string *)&ValidateType,_,uVar16);
            std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
            pcVar27 = " must be OpTypeCooperativeMatrixNV.";
          }
          goto LAB_0058d521;
        }
        goto LAB_0058d4b7;
      case 0x14f7:
        pcVar27 = "spv::Op::OpCooperativeMatrixLoadTensorNV";
        pIVar28 = (Instruction *)inst;
        goto LAB_0058d9fc;
      case 0x14f8:
        uVar16 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,1);
        pIVar28 = ValidationState_t::FindDef(_,uVar16);
        pcVar27 = "spv::Op::OpCooperativeMatrixStoreTensorNV";
LAB_0058d9fc:
        uVar20 = (pIVar28->inst_).type_id;
        pIVar28 = ValidationState_t::FindDef(_,uVar20);
        sVar33 = *(short *)((long)&(inst->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 2);
        if ((pIVar28->inst_).opcode != 0x1168) {
          if (sVar33 == 0x14f7) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            pcVar27 = "spv::Op::OpCooperativeMatrixLoadTensorNV Result Type <id> ";
          }
          else {
            ValidationState_t::diag
                      ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            pcVar27 = "spv::Op::OpCooperativeMatrixStoreTensorNV Object type <id> ";
          }
          goto LAB_0058e240;
        }
        uVar16 = Instruction::GetOperandAs<unsigned_int>
                           ((Instruction *)inst,(ulong)((uint)(sVar33 == 0x14f7) * 2));
        pIVar31 = ValidationState_t::FindDef(_,uVar16);
        if (pIVar31 == (Instruction *)0x0) {
LAB_0058e4b4:
          ValidationState_t::diag
                    ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          std::operator<<((ostream *)&errorVUID,pcVar27);
          std::operator<<((ostream *)&errorVUID," Pointer <id> ");
LAB_0058e4f7:
          ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar16);
          std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
          pcVar27 = " is not a logical pointer.";
          goto LAB_0058ed4c;
        }
        AVar18 = ValidationState_t::addressing_model(_);
        if (AVar18 == AddressingModelLogical) {
          bVar8 = (_->features_).variable_pointers;
          if ((bool)bVar8 == false) {
            iVar19 = spvOpcodeReturnsLogicalPointer((uint)(pIVar31->inst_).opcode);
            if (iVar19 == 0) goto LAB_0058e4b4;
            bVar8 = (_->features_).variable_pointers;
          }
          if (((bVar8 & 1) != 0) &&
             (bVar14 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar31->inst_).opcode),
             !bVar14)) goto LAB_0058e4b4;
        }
        id = (pIVar31->inst_).type_id;
        pIVar31 = ValidationState_t::FindDef(_,id);
        if ((pIVar31 == (Instruction *)0x0) || ((pIVar31->inst_).opcode != 0x20)) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          std::operator<<((ostream *)&errorVUID,pcVar27);
          std::operator<<((ostream *)&errorVUID," type for pointer <id> ");
LAB_0058e33e:
          ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar16);
          std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
          pcVar27 = " is not a pointer type.";
          goto LAB_0058ed4c;
        }
        SVar15 = Instruction::GetOperandAs<spv::StorageClass>(pIVar31,1);
        if (((SVar15 != StorageClassWorkgroup) && (SVar15 != StorageBuffer)) &&
           (SVar15 != PhysicalStorageBuffer)) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          ValidationState_t::VkErrorID_abi_cxx11_(&instr_name,_,0x230d,(char *)0x0);
          std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
          std::operator<<((ostream *)&errorVUID,pcVar27);
          std::operator<<((ostream *)&errorVUID," storage class for pointer type <id> ");
          ValidationState_t::getIdName_abi_cxx11_((string *)&ValidateType,_,id);
          std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
          std::operator<<((ostream *)&errorVUID,
                          " is not Workgroup, StorageBuffer, or PhysicalStorageBuffer.");
LAB_0058f726:
          std::__cxx11::string::_M_dispose();
          goto LAB_0058e846;
        }
        if (*(short *)((long)&(inst->operands_).
                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                              ._M_impl.super__Vector_impl_data._M_start + 2) == 0x14f7) {
          uVar16 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,3);
          pIVar31 = ValidationState_t::FindDef(_,uVar16);
          if ((pIVar31 == (Instruction *)0x0) || ((pIVar31->inst_).type_id != uVar20)) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            std::operator<<((ostream *)&errorVUID,pcVar27);
            std::operator<<((ostream *)&errorVUID," Object <id> ");
            ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar16);
            std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
            pcVar27 = " type does not match Result Type.";
            goto LAB_0058ed4c;
          }
          sVar37 = (ulong)(*(short *)((long)&(inst->operands_).
                                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                             ._M_impl.super__Vector_impl_data._M_start + 2) ==
                          0x14f7) * 2 + 2;
        }
        else {
          sVar37 = 2;
        }
        uVar16 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,sVar37);
        pIVar31 = ValidationState_t::FindDef(_,uVar16);
        if ((pIVar31 == (Instruction *)0x0) ||
           (pIVar29 = ValidationState_t::FindDef(_,(pIVar31->inst_).type_id),
           (pIVar29->inst_).opcode != 0x14fa)) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          std::operator<<((ostream *)&errorVUID,pcVar27);
          std::operator<<((ostream *)&errorVUID," TensorLayout <id> ");
          ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar16);
          std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
          pcVar27 = " does not have a tensor layout type.";
          goto LAB_0058ed4c;
        }
        uVar16 = (uint)(*(short *)((long)&(inst->operands_).
                                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 2) == 0x14f7)
                 * 2 + 3;
        if (((ulong)uVar16 <
             (ulong)((long)inst->context_ -
                     *(long *)&(inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                               is_sentinel_ >> 4)) &&
           (sVar21 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar16), sVar21 != SPV_SUCCESS)) {
          return sVar21;
        }
        local_268 = pIVar31;
        uVar22 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,(ulong)uVar16);
        iVar23 = anon_unknown_2::MemoryAccessNumWords(uVar22);
        uVar22 = uVar16 + iVar23;
        TVar24 = Instruction::GetOperandAs<spv::TensorAddressingOperandsMask>
                           ((Instruction *)inst,(ulong)uVar22);
        if ((ulong)((long)inst->context_ -
                    *(long *)&(inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                              is_sentinel_ >> 4) <
            (ulong)((TVar24 & TensorAddressingOperandsTensorViewMask) +
                    iVar23 + uVar16 + (uint)((TVar24 >> 1 & 1) != 0) + 1)) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          std::operator<<((ostream *)&errorVUID,pcVar27);
          pcVar27 = " not enough tensor addressing operands.";
LAB_0058e468:
          std::operator<<((ostream *)&errorVUID,pcVar27);
          goto LAB_0058ed66;
        }
        uVar16 = uVar22 + 1;
        if ((TVar24 & TensorAddressingOperandsTensorViewMask) != MaskNone) {
          uVar16 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,(ulong)uVar16);
          pIVar31 = ValidationState_t::FindDef(_,uVar16);
          if ((pIVar31 != (Instruction *)0x0) &&
             (pIVar31 = ValidationState_t::FindDef(_,(pIVar31->inst_).type_id),
             (pIVar31->inst_).opcode == 0x14fb)) {
            uVar16 = uVar22 + 2;
            goto LAB_0058fb41;
          }
          ValidationState_t::diag
                    ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          std::operator<<((ostream *)&errorVUID,pcVar27);
          std::operator<<((ostream *)&errorVUID," TensorView <id> ");
          ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar16);
          std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
          pcVar27 = " does not have a tensor view type.";
          goto LAB_0058e836;
        }
LAB_0058fb41:
        if ((TVar24 & DecodeFunc) != MaskNone) {
          if (*(short *)((long)&(inst->operands_).
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_start + 2) != 0x14f8) {
            uVar16 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,(ulong)uVar16);
            pIVar31 = ValidationState_t::FindDef(_,uVar16);
            if ((pIVar31 == (Instruction *)0x0) || ((pIVar31->inst_).opcode != 0x36)) {
              ValidationState_t::diag
                        ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
              std::operator<<((ostream *)&errorVUID,pcVar27);
              std::operator<<((ostream *)&errorVUID," DecodeFunc <id> ");
              ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar16);
              std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
              pcVar27 = " is not a function.";
            }
            else {
              uVar22 = Instruction::GetOperandAs<unsigned_int>(pIVar28,1);
              sVar37 = 3;
              uVar26 = Instruction::GetOperandAs<unsigned_int>(pIVar31,3);
              pIVar28 = ValidationState_t::FindDef(_,uVar26);
              uVar26 = Instruction::GetOperandAs<unsigned_int>(pIVar28,1);
              if (uVar26 == uVar22) {
                uVar22 = Instruction::GetOperandAs<unsigned_int>(pIVar28,2);
                pIVar31 = ValidationState_t::FindDef(_,uVar22);
                SVar15 = Instruction::GetOperandAs<spv::StorageClass>(pIVar31,1);
                if (SVar15 == PhysicalStorageBuffer) {
                  pIVar31 = ValidationState_t::FindDef(_,(local_268->inst_).type_id);
                  for (; sVar37 != 5; sVar37 = sVar37 + 1) {
                    uVar22 = Instruction::GetOperandAs<unsigned_int>(pIVar28,sVar37);
                    pIVar29 = ValidationState_t::FindDef(_,uVar22);
                    if ((pIVar29->inst_).opcode != 0x1c) {
LAB_00590a70:
                      ValidationState_t::diag
                                ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,
                                 (Instruction *)inst);
                      std::operator<<((ostream *)&errorVUID,pcVar27);
                      std::operator<<((ostream *)&errorVUID," DecodeFunc <id> ");
                      ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar16);
                      std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
                      std::operator<<((ostream *)&errorVUID,
                                      " second/third parameter must be array of 32-bit integer with "
                                     );
                      pcVar27 = " dimension equal to the tensor dimension.";
                      goto LAB_0058ed4c;
                    }
                    uVar22 = Instruction::GetOperandAs<unsigned_int>(pIVar29,2);
                    bVar14 = ValidationState_t::EvalConstantValUint64
                                       (_,uVar22,(uint64_t *)&ValidateType);
                    if (bVar14) {
                      uVar22 = Instruction::GetOperandAs<unsigned_int>(pIVar31,1);
                      bVar14 = ValidationState_t::EvalConstantValUint64
                                         (_,uVar22,(uint64_t *)&opcode_name);
                      if ((bVar14) && (ValidateType._ != (ValidationState_t *)opcode_name))
                      goto LAB_00590a70;
                    }
                  }
                  goto switchD_0058d24a_caseD_14f1;
                }
                ValidationState_t::diag
                          ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst
                          );
                std::operator<<((ostream *)&errorVUID,pcVar27);
                std::operator<<((ostream *)&errorVUID," DecodeFunc <id> ");
                ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar16);
                std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
                pcVar27 = " first parameter must be pointer to PhysicalStorageBuffer.";
              }
              else {
                ValidationState_t::diag
                          ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst
                          );
                std::operator<<((ostream *)&errorVUID,pcVar27);
                std::operator<<((ostream *)&errorVUID," DecodeFunc <id> ");
                ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar16);
                std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
                pcVar27 = " return type must match matrix component type.";
              }
            }
            goto LAB_0058ed4c;
          }
          ValidationState_t::diag
                    ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          pcVar27 = "OpCooperativeMatrixStoreTensorNV does not support DecodeFunc.";
          goto LAB_0058e468;
        }
        goto switchD_0058d24a_caseD_14f1;
      default:
        if (uVar2 - 0x191 < 3) {
          AVar18 = ValidationState_t::addressing_model(_);
          if ((AVar18 == AddressingModelLogical) && ((_->features_).variable_pointers == false)) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            pcVar27 = 
            "Instruction cannot for logical addressing model be used without a variable pointers capability"
            ;
          }
          else {
            pIVar28 = ValidationState_t::FindDef
                                (_,*(uint32_t *)
                                    &(inst->operands_).
                                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                     ._M_impl.super__Vector_impl_data._M_finish);
            if (*(short *)((long)&(inst->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 2) == 0x193) {
              if ((pIVar28 == (Instruction *)0x0) || ((pIVar28->inst_).opcode != 0x15)) {
                ValidationState_t::diag
                          ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst
                          );
                pcVar27 = "Result Type must be an integer scalar";
              }
              else {
LAB_0058d563:
                uVar16 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,2);
                pIVar28 = ValidationState_t::FindDef(_,uVar16);
                uVar16 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,3);
                pIVar31 = ValidationState_t::FindDef(_,uVar16);
                pIVar29 = ValidationState_t::FindDef(_,(pIVar28->inst_).type_id);
                pIVar30 = ValidationState_t::FindDef(_,(pIVar31->inst_).type_id);
                if ((pIVar29 == (Instruction *)0x0) ||
                   ((((uVar4 = (pIVar29->inst_).opcode, uVar4 != 0x20 && (uVar4 != 0x1141)) ||
                     (pIVar30 == (Instruction *)0x0)) ||
                    ((uVar3 = (pIVar30->inst_).opcode, uVar3 != 0x20 && (uVar3 != 0x1141)))))) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,
                             (Instruction *)inst);
                  pcVar27 = "Operand type must be a pointer";
                }
                else if ((*(short *)((long)&(inst->operands_).
                                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                            ._M_impl.super__Vector_impl_data._M_start + 2) == 0x193)
                        || ((uVar4 != 0x1141 && (uVar3 != 0x1141)))) {
                  if ((pIVar28->inst_).type_id == (pIVar31->inst_).type_id) goto LAB_0058f5b4;
                  ValidationState_t::diag
                            ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,
                             (Instruction *)inst);
                  pcVar27 = "The types of Operand 1 and Operand 2 must match";
                }
                else {
                  SVar15 = Instruction::GetOperandAs<spv::StorageClass>(pIVar29,1);
                  SVar25 = Instruction::GetOperandAs<spv::StorageClass>(pIVar30,1);
                  if (SVar15 == SVar25) {
LAB_0058f5b4:
                    SVar15 = Instruction::GetOperandAs<spv::StorageClass>(pIVar29,1);
                    AVar18 = ValidationState_t::addressing_model(_);
                    if (AVar18 == AddressingModelLogical) {
                      if ((SVar15 & ~Generic) == StorageClassWorkgroup) {
                        if ((SVar15 != StorageClassWorkgroup) ||
                           (bVar14 = EnumSet<spv::Capability>::contains
                                               (&_->module_capabilities_,CapabilityVariablePointers)
                           , bVar14)) goto switchD_0058d24a_caseD_14f1;
                        ValidationState_t::diag
                                  ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,
                                   (Instruction *)inst);
                        pcVar27 = 
                        "Workgroup storage class pointer requires VariablePointers capability to be specified"
                        ;
                      }
                      else {
                        ValidationState_t::diag
                                  ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,
                                   (Instruction *)inst);
                        pcVar27 = "Invalid pointer storage class";
                      }
                    }
                    else {
                      if (SVar15 != PhysicalStorageBuffer) goto switchD_0058d24a_caseD_14f1;
                      ValidationState_t::diag
                                ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,
                                 (Instruction *)inst);
                      pcVar27 = "Cannot use a pointer in the PhysicalStorageBuffer storage class";
                    }
                  }
                  else {
                    ValidationState_t::diag
                              ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,
                               (Instruction *)inst);
                    pcVar27 = "Pointer storage classes must match";
                  }
                }
              }
            }
            else {
              if ((pIVar28 != (Instruction *)0x0) && ((pIVar28->inst_).opcode == 0x14))
              goto LAB_0058d563;
              ValidationState_t::diag
                        ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
              pcVar27 = "Result Type must be OpTypeBool";
            }
          }
          goto LAB_0058e468;
        }
        if (opcode != OpCooperativeMatrixLoadKHR) {
          if (opcode == OpCooperativeMatrixStoreKHR) {
            uVar16 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,1);
            pIVar28 = ValidationState_t::FindDef(_,uVar16);
            local_2e0 = "spv::Op::OpCooperativeMatrixStoreKHR";
            goto LAB_0058dd33;
          }
          if (opcode == OpCooperativeMatrixLengthKHR) goto switchD_0058d24a_caseD_14f2;
          if (opcode != OpRawAccessChainNV) goto switchD_0058d24a_caseD_14f1;
          opcode_name = (char *)inst;
          pcVar27 = spvOpcodeString(OpRawAccessChainNV);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&errorVUID,pcVar27,(allocator<char> *)&ValidateType);
          std::operator+(&instr_name,"Op",&errorVUID);
          std::__cxx11::string::_M_dispose();
          pIVar28 = ValidationState_t::FindDef
                              (_,*(uint32_t *)
                                  &(inst->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_finish);
          if ((pIVar28->inst_).opcode == 0x20) {
            SVar15 = Instruction::GetOperandAs<spv::StorageClass>(pIVar28,1);
            if (((SVar15 != StorageClassUniform) && (SVar15 != StorageBuffer)) &&
               (SVar15 != PhysicalStorageBuffer)) {
              ValidationState_t::diag
                        ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,(Instruction *)inst
                        );
              std::operator<<((ostream *)&errorVUID,"The Result Type of ");
              std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
              std::operator<<((ostream *)&errorVUID," <id> ");
              ValidationState_t::getIdName_abi_cxx11_
                        ((string *)&ValidateType,_,
                         *(uint32_t *)
                          ((long)&(inst->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + 4));
              std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
              pcVar27 = 
              " must point to a storage class of StorageBuffer, PhysicalStorageBuffer, or Uniform.";
              goto LAB_0058d521;
            }
            uVar16 = Instruction::GetOperandAs<unsigned_int>(pIVar28,2);
            pIVar28 = ValidationState_t::FindDef(_,uVar16);
            uVar16 = (uint)(pIVar28->inst_).opcode;
            if ((uVar16 < 0x1f) && ((0x51000000U >> (uVar16 & 0x1f) & 1) != 0)) {
              ValidationState_t::diag
                        ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,(Instruction *)inst
                        );
              std::operator<<((ostream *)&errorVUID,"The Result Type of ");
              std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
              std::operator<<((ostream *)&errorVUID," <id> ");
              ValidationState_t::getIdName_abi_cxx11_
                        ((string *)&ValidateType,_,
                         *(uint32_t *)
                          ((long)&(inst->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + 4));
              std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
              pcVar27 = " must not point to OpTypeArray, OpTypeMatrix, or OpTypeStruct.";
              goto LAB_0058d521;
            }
            uVar16 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,3);
            pIVar28 = ValidationState_t::FindDef(_,uVar16);
            if ((pIVar28->inst_).opcode != 0x2b) {
              ValidationState_t::diag
                        ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,(Instruction *)inst
                        );
              std::operator<<((ostream *)&errorVUID,"The Stride of ");
              std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
              std::operator<<((ostream *)&errorVUID," <id> ");
              ValidationState_t::getIdName_abi_cxx11_
                        ((string *)&ValidateType,_,
                         *(uint32_t *)
                          ((long)&(inst->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + 4));
              std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
              pcVar27 = " must be OpConstant. Found Op";
              goto LAB_0058e206;
            }
            pIVar31 = ValidationState_t::FindDef(_,(pIVar28->inst_).type_id);
            if ((pIVar31->inst_).opcode != 0x15) {
              ValidationState_t::diag
                        ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,(Instruction *)inst
                        );
              std::operator<<((ostream *)&errorVUID,"The type of Stride of ");
              std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
              std::operator<<((ostream *)&errorVUID," <id> ");
              ValidationState_t::getIdName_abi_cxx11_
                        ((string *)&ValidateType,_,
                         *(uint32_t *)
                          ((long)&(inst->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + 4));
              std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
              std::operator<<((ostream *)&errorVUID," must be OpTypeInt. Found Op");
              uVar2 = (pIVar31->inst_).opcode;
              goto LAB_0058e214;
            }
            ValidateType.inst = (Instruction **)&opcode_name;
            ValidateType._ = _;
            ValidateType.instr_name = &instr_name;
            sVar21 = anon_unknown_2::ValidateRawAccessChain::anon_class_24_3_e757d3e0::operator()
                               (&ValidateType,"Index",4);
            if ((sVar21 == SPV_SUCCESS) &&
               (sVar21 = anon_unknown_2::ValidateRawAccessChain::anon_class_24_3_e757d3e0::
                         operator()(&ValidateType,"Offset",5), sVar21 == SPV_SUCCESS)) {
              sVar21 = SPV_SUCCESS;
              if ((ulong)(*(long *)(opcode_name + 0x20) - *(long *)(opcode_name + 0x18)) < 0x61)
              goto LAB_0058d540;
              uVar16 = Instruction::GetOperandAs<unsigned_int>((Instruction *)opcode_name,6);
              if ((uVar16 & 2) == 0) {
LAB_00590425:
                if ((uVar16 & 1) == 0) {
                  if ((SVar15 == PhysicalStorageBuffer & (byte)((uVar16 & 2) >> 1)) != 0) {
LAB_005905e7:
                    ValidationState_t::diag
                              ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,
                               (Instruction *)opcode_name);
                    pcVar27 = 
                    "Storage class cannot be PhysicalStorageBuffer when raw access chain robustness is used."
                    ;
                    goto LAB_0059060c;
                  }
                }
                else {
                  if (SVar15 == PhysicalStorageBuffer) goto LAB_005905e7;
                  sVar21 = SPV_SUCCESS;
                  if ((uVar16 & 2) != 0) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,
                               (Instruction *)opcode_name);
                    pcVar27 = 
                    "Per-component robustness and per-element robustness are mutually exclusive.";
                    goto LAB_0059060c;
                  }
                }
                goto LAB_0058d540;
              }
              stride_value = 0;
              bVar14 = ValidationState_t::EvalConstantValUint64
                                 (_,(pIVar28->inst_).result_id,&stride_value);
              if ((!bVar14) || (stride_value != 0)) goto LAB_00590425;
              ValidationState_t::diag
                        ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,
                         (Instruction *)opcode_name);
              pcVar27 = "Stride must not be zero when per-element robustness is used.";
LAB_0059060c:
              std::operator<<((ostream *)&errorVUID,pcVar27);
              goto LAB_0058d53b;
            }
            goto LAB_0058d540;
          }
          ValidationState_t::diag
                    ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,(Instruction *)inst);
          std::operator<<((ostream *)&errorVUID,"The Result Type of ");
          std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
          std::operator<<((ostream *)&errorVUID," <id> ");
          ValidationState_t::getIdName_abi_cxx11_
                    ((string *)&ValidateType,_,
                     *(uint32_t *)
                      ((long)&(inst->operands_).
                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                              ._M_impl.super__Vector_impl_data._M_finish + 4));
          std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
          pcVar27 = " must be OpTypePointer. Found Op";
LAB_0058e206:
          std::operator<<((ostream *)&errorVUID,pcVar27);
          uVar2 = (pIVar28->inst_).opcode;
LAB_0058e214:
          pcVar27 = spvOpcodeString((uint)uVar2);
          std::operator<<((ostream *)&errorVUID,pcVar27);
          std::operator<<((ostream *)&errorVUID,'.');
          goto LAB_0058d529;
        }
        local_2e0 = "spv::Op::OpCooperativeMatrixLoadKHR";
        pIVar28 = (Instruction *)inst;
LAB_0058dd33:
        uVar20 = (pIVar28->inst_).type_id;
        pIVar28 = ValidationState_t::FindDef(_,uVar20);
        sVar33 = *(short *)((long)&(inst->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 2);
        if ((pIVar28->inst_).opcode != 0x1168) {
          if (sVar33 == 0x1169) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            pcVar27 = "spv::Op::OpCooperativeMatrixLoadKHR Result Type <id> ";
          }
          else {
            ValidationState_t::diag
                      ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            pcVar27 = "spv::Op::OpCooperativeMatrixStoreKHR Object type <id> ";
          }
          goto LAB_0058e240;
        }
        uVar16 = Instruction::GetOperandAs<unsigned_int>
                           ((Instruction *)inst,(ulong)((uint)(sVar33 == 0x1169) * 2));
        pIVar28 = ValidationState_t::FindDef(_,uVar16);
        if (pIVar28 != (Instruction *)0x0) {
          AVar18 = ValidationState_t::addressing_model(_);
          if (AVar18 == AddressingModelLogical) {
            bVar8 = (_->features_).variable_pointers;
            if ((bool)bVar8 == false) {
              iVar19 = spvOpcodeReturnsLogicalPointer((uint)(pIVar28->inst_).opcode);
              if (iVar19 == 0) goto LAB_0058e610;
              bVar8 = (_->features_).variable_pointers;
            }
            if (((bVar8 & 1) != 0) &&
               (bVar14 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar28->inst_).opcode),
               !bVar14)) goto LAB_0058e610;
          }
          uVar20 = (pIVar28->inst_).type_id;
          pIVar31 = ValidationState_t::FindDef(_,uVar20);
          if ((pIVar31 == (Instruction *)0x0) ||
             ((uVar4 = (pIVar31->inst_).opcode, uVar4 != 0x20 && (uVar4 != 0x1141))))
          goto LAB_0058dfa3;
          SVar15 = Instruction::GetOperandAs<spv::StorageClass>(pIVar31,1);
          bVar14 = spvIsVulkanEnv(_->context_->target_env);
          if ((bVar14) &&
             (((SVar15 != StorageClassWorkgroup && (SVar15 != StorageBuffer)) &&
              (SVar15 != PhysicalStorageBuffer)))) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            ValidationState_t::VkErrorID_abi_cxx11_(&instr_name,_,0x230d,(char *)0x0);
            std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
            std::operator<<((ostream *)&errorVUID,local_2e0);
            std::operator<<((ostream *)&errorVUID," storage class for pointer type <id> ");
            ValidationState_t::getIdName_abi_cxx11_((string *)&ValidateType,_,uVar20);
            std::operator<<((ostream *)&errorVUID,(string *)&ValidateType);
            std::operator<<((ostream *)&errorVUID,
                            " is not Workgroup, StorageBuffer, or PhysicalStorageBuffer.");
            goto LAB_0058f726;
          }
          if (uVar4 != 0x1141) {
            uVar16 = Instruction::GetOperandAs<unsigned_int>(pIVar31,2);
            pIVar31 = ValidationState_t::FindDef(_,uVar16);
            if ((pIVar31 != (Instruction *)0x0) &&
               ((bVar14 = ValidationState_t::IsIntScalarOrVectorType(_,uVar16), bVar14 ||
                (bVar14 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar16), bVar14))))
            goto LAB_0058de40;
            goto LAB_0058e9b5;
          }
LAB_0058de40:
          uVar16 = Instruction::GetOperandAs<unsigned_int>
                             ((Instruction *)inst,
                              (ulong)(*(short *)((long)&(inst->operands_).
                                                                                                                
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 2) ==
                                     0x1169) | 2);
          pIVar28 = ValidationState_t::FindDef(_,uVar16);
          if ((pIVar28 == (Instruction *)0x0) ||
             ((bVar14 = ValidationState_t::IsIntScalarType(_,(pIVar28->inst_).type_id), !bVar14 ||
              (iVar19 = spvOpcodeIsConstant((uint)(pIVar28->inst_).opcode), iVar19 == 0)))) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            std::operator<<((ostream *)&errorVUID,"MemoryLayout operand <id> ");
            ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar16);
            std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
            pcVar27 = " must be a 32-bit integer constant instruction.";
            goto LAB_0058ed4c;
          }
          bVar14 = ValidationState_t::EvalConstantValUint64(_,uVar16,(uint64_t *)&ValidateType);
          sVar33 = *(short *)((long)&(inst->operands_).
                                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 2);
          sVar37 = (ulong)(sVar33 == 0x1169) + 3;
          uVar39 = (long)inst->context_ -
                   *(long *)&(inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                             is_sentinel_ >> 4;
          if (uVar39 <= sVar37) {
            if (bVar14 && ValidateType._ < (ValidationState_t *)0x2) {
              ValidationState_t::diag
                        ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
              std::operator<<((ostream *)&errorVUID,"MemoryLayout ");
              std::ostream::_M_insert<unsigned_long>((ulong)&errorVUID);
              pcVar27 = " requires a Stride.";
              goto LAB_0058e468;
            }
LAB_0058fac9:
            uVar16 = sVar33 == 0x1169 | 4;
            if ((uVar39 <= uVar16) ||
               (local_48 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar16), local_48 == SPV_SUCCESS
               )) {
              local_48 = SPV_SUCCESS;
            }
            goto LAB_0058ed6b;
          }
          uVar20 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,sVar37);
          pIVar28 = ValidationState_t::FindDef(_,uVar20);
          if ((pIVar28 != (Instruction *)0x0) &&
             (bVar14 = ValidationState_t::IsIntScalarType(_,(pIVar28->inst_).type_id), bVar14)) {
            sVar33 = *(short *)((long)&(inst->operands_).
                                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 2);
            uVar39 = (long)inst->context_ -
                     *(long *)&(inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                               is_sentinel_ >> 4;
            goto LAB_0058fac9;
          }
          goto LAB_0058f233;
        }
        goto LAB_0058e610;
      }
      uVar20 = (pIVar28->inst_).type_id;
      pIVar28 = ValidationState_t::FindDef(_,uVar20);
      sVar33 = *(short *)((long)&(inst->operands_).
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 2);
      if ((pIVar28->inst_).opcode != 0x14ee) {
        if (sVar33 == 0x14ef) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          pcVar27 = "spv::Op::OpCooperativeMatrixLoadNV Result Type <id> ";
        }
        else {
          ValidationState_t::diag
                    ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          pcVar27 = "spv::Op::OpCooperativeMatrixStoreNV Object type <id> ";
        }
LAB_0058e240:
        std::operator<<((ostream *)&errorVUID,pcVar27);
        ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar20);
        std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
        pcVar27 = " is not a cooperative matrix type.";
        goto LAB_0058ed4c;
      }
      uVar16 = Instruction::GetOperandAs<unsigned_int>
                         ((Instruction *)inst,(ulong)((uint)(sVar33 == 0x14ef) * 2));
      pIVar28 = ValidationState_t::FindDef(_,uVar16);
      if (pIVar28 != (Instruction *)0x0) {
        AVar18 = ValidationState_t::addressing_model(_);
        if (AVar18 == AddressingModelLogical) {
          bVar8 = (_->features_).variable_pointers;
          if ((bool)bVar8 == false) {
            iVar19 = spvOpcodeReturnsLogicalPointer((uint)(pIVar28->inst_).opcode);
            if (iVar19 == 0) goto LAB_0058e610;
            bVar8 = (_->features_).variable_pointers;
          }
          if (((bVar8 & 1) != 0) &&
             (bVar14 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar28->inst_).opcode),
             !bVar14)) goto LAB_0058e610;
        }
        uVar20 = (pIVar28->inst_).type_id;
        pIVar31 = ValidationState_t::FindDef(_,uVar20);
        if ((pIVar31 == (Instruction *)0x0) || ((pIVar31->inst_).opcode != 0x20)) {
LAB_0058dfa3:
          ValidationState_t::diag
                    ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          std::operator<<((ostream *)&errorVUID,local_2e0);
          std::operator<<((ostream *)&errorVUID," type for pointer <id> ");
LAB_0058dfe5:
          ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar16);
          std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
          pcVar27 = " is not a pointer type.";
          goto LAB_0058e836;
        }
        SVar15 = Instruction::GetOperandAs<spv::StorageClass>(pIVar31,1);
        if (((SVar15 != StorageClassWorkgroup) && (SVar15 != StorageBuffer)) &&
           (SVar15 != PhysicalStorageBuffer)) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          std::operator<<((ostream *)&errorVUID,local_2e0);
          std::operator<<((ostream *)&errorVUID," storage class for pointer type <id> ");
          ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar20);
          std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
          pcVar27 = " is not Workgroup or StorageBuffer.";
          goto LAB_0058e836;
        }
        uVar16 = Instruction::GetOperandAs<unsigned_int>(pIVar31,2);
        pIVar31 = ValidationState_t::FindDef(_,uVar16);
        if ((pIVar31 == (Instruction *)0x0) ||
           ((bVar14 = ValidationState_t::IsIntScalarOrVectorType(_,uVar16), !bVar14 &&
            (bVar14 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar16), !bVar14)))) {
LAB_0058e9b5:
          ValidationState_t::diag
                    ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          std::operator<<((ostream *)&errorVUID,local_2e0);
          std::operator<<((ostream *)&errorVUID," Pointer <id> ");
          ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,(pIVar28->inst_).result_id);
          std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
          std::operator<<((ostream *)&errorVUID,"s Type must be a scalar or vector type.");
          std::__cxx11::string::_M_dispose();
          goto LAB_0058ed66;
        }
        uVar20 = Instruction::GetOperandAs<unsigned_int>
                           ((Instruction *)inst,
                            (ulong)(*(short *)((long)&(inst->operands_).
                                                                                                            
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 2) ==
                                   0x14ef) | 2);
        pIVar28 = ValidationState_t::FindDef(_,uVar20);
        if ((pIVar28 != (Instruction *)0x0) &&
           (bVar14 = ValidationState_t::IsIntScalarType(_,(pIVar28->inst_).type_id), bVar14)) {
          uVar16 = Instruction::GetOperandAs<unsigned_int>
                             ((Instruction *)inst,
                              (ulong)(*(short *)((long)&(inst->operands_).
                                                                                                                
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 2) ==
                                     0x14ef) + 3);
          pIVar28 = ValidationState_t::FindDef(_,uVar16);
          if (((pIVar28 == (Instruction *)0x0) ||
              (bVar14 = ValidationState_t::IsBoolScalarType(_,(pIVar28->inst_).type_id), !bVar14))
             || ((iVar19 = spvOpcodeIsConstant((uint)(pIVar28->inst_).opcode), iVar19 == 0 &&
                 (iVar19 = spvOpcodeIsSpecConstant((uint)(pIVar28->inst_).opcode), iVar19 == 0)))) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            std::operator<<((ostream *)&errorVUID,"Column Major operand <id> ");
            ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar16);
            std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
            pcVar27 = " must be a boolean constant instruction.";
            goto LAB_0058ed4c;
          }
          uVar16 = *(short *)((long)&(inst->operands_).
                                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 2) == 0x14ef | 4;
          goto LAB_0058d980;
        }
LAB_0058f233:
        ValidationState_t::diag
                  ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        std::operator<<((ostream *)&errorVUID,"Stride operand <id> ");
LAB_0058f767:
        ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar20);
        std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
        pcVar27 = " must be a scalar integer type.";
        goto LAB_0058ed4c;
      }
LAB_0058e610:
      ValidationState_t::diag
                ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::operator<<((ostream *)&errorVUID,local_2e0);
      std::operator<<((ostream *)&errorVUID," Pointer <id> ");
LAB_0058e81f:
      ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar16);
      std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
      pcVar27 = " is not a logical pointer.";
LAB_0058e836:
      std::operator<<((ostream *)&errorVUID,pcVar27);
LAB_0058e846:
      std::__cxx11::string::_M_dispose();
      goto LAB_0058ed66;
    }
    uVar20 = (pIVar28->inst_).type_id;
    pIVar28 = ValidationState_t::FindDef(_,uVar20);
    sVar33 = *(short *)((long)&(inst->operands_).
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_start + 2);
    if ((pIVar28->inst_).opcode == 0x14a8) {
      sVar21 = anon_unknown_2::ValidateCooperativeVectorPointer
                         (_,inst,pcVar27,(uint)(sVar33 == 0x14b6) * 2);
      if (sVar21 != SPV_SUCCESS) {
        return sVar21;
      }
      uVar16 = (*(short *)((long)&(inst->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 2) == 0x14b6) + 3;
LAB_0058d980:
      if ((ulong)uVar16 <
          (ulong)((long)inst->context_ -
                  *(long *)&(inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_
                 >> 4)) {
        sVar21 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar16);
        break;
      }
    }
    else {
      if (sVar33 == 0x14b6) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        pcVar27 = "spv::Op::OpCooperativeVectorLoadNV Result Type <id> ";
      }
      else {
        ValidationState_t::diag
                  ((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        pcVar27 = "spv::Op::OpCooperativeVectorStoreNV Object type <id> ";
      }
LAB_0058ed20:
      std::operator<<((ostream *)&errorVUID,pcVar27);
LAB_0058ed35:
      ValidationState_t::getIdName_abi_cxx11_(&instr_name,_,uVar20);
      std::operator<<((ostream *)&errorVUID,(string *)&instr_name);
      pcVar27 = " is not a cooperative vector type.";
LAB_0058ed4c:
      std::operator<<((ostream *)&errorVUID,pcVar27);
LAB_0058ed5b:
      std::__cxx11::string::_M_dispose();
LAB_0058ed66:
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&errorVUID);
LAB_0058ed6b:
      if (local_48 != SPV_SUCCESS) {
        return local_48;
      }
    }
    goto switchD_0058d24a_caseD_14f1;
  }
LAB_0058d433:
  if (sVar21 == SPV_SUCCESS) {
switchD_0058d24a_caseD_14f1:
    sVar21 = SPV_SUCCESS;
  }
  return sVar21;
}

Assistant:

spv_result_t MemoryPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpVariable:
    case spv::Op::OpUntypedVariableKHR:
      if (auto error = ValidateVariable(_, inst)) return error;
      break;
    case spv::Op::OpLoad:
      if (auto error = ValidateLoad(_, inst)) return error;
      break;
    case spv::Op::OpStore:
      if (auto error = ValidateStore(_, inst)) return error;
      break;
    case spv::Op::OpCopyMemory:
    case spv::Op::OpCopyMemorySized:
      if (auto error = ValidateCopyMemory(_, inst)) return error;
      break;
    case spv::Op::OpPtrAccessChain:
    case spv::Op::OpUntypedPtrAccessChainKHR:
    case spv::Op::OpUntypedInBoundsPtrAccessChainKHR:
      if (auto error = ValidatePtrAccessChain(_, inst)) return error;
      break;
    case spv::Op::OpAccessChain:
    case spv::Op::OpInBoundsAccessChain:
    case spv::Op::OpInBoundsPtrAccessChain:
    case spv::Op::OpUntypedAccessChainKHR:
    case spv::Op::OpUntypedInBoundsAccessChainKHR:
      if (auto error = ValidateAccessChain(_, inst)) return error;
      break;
    case spv::Op::OpRawAccessChainNV:
      if (auto error = ValidateRawAccessChain(_, inst)) return error;
      break;
    case spv::Op::OpArrayLength:
    case spv::Op::OpUntypedArrayLengthKHR:
      if (auto error = ValidateArrayLength(_, inst)) return error;
      break;
    case spv::Op::OpCooperativeMatrixLoadNV:
    case spv::Op::OpCooperativeMatrixStoreNV:
      if (auto error = ValidateCooperativeMatrixLoadStoreNV(_, inst))
        return error;
      break;
    case spv::Op::OpCooperativeMatrixLengthKHR:
    case spv::Op::OpCooperativeMatrixLengthNV:
      if (auto error = ValidateCooperativeMatrixLengthNV(_, inst)) return error;
      break;
    case spv::Op::OpCooperativeMatrixLoadKHR:
    case spv::Op::OpCooperativeMatrixStoreKHR:
      if (auto error = ValidateCooperativeMatrixLoadStoreKHR(_, inst))
        return error;
      break;
    case spv::Op::OpCooperativeMatrixLoadTensorNV:
    case spv::Op::OpCooperativeMatrixStoreTensorNV:
      if (auto error = ValidateCooperativeMatrixLoadStoreTensorNV(_, inst))
        return error;
      break;
    case spv::Op::OpCooperativeVectorLoadNV:
    case spv::Op::OpCooperativeVectorStoreNV:
      if (auto error = ValidateCooperativeVectorLoadStoreNV(_, inst))
        return error;
      break;
    case spv::Op::OpCooperativeVectorOuterProductAccumulateNV:
      if (auto error = ValidateCooperativeVectorOuterProductNV(_, inst))
        return error;
      break;
    case spv::Op::OpCooperativeVectorReduceSumAccumulateNV:
      if (auto error = ValidateCooperativeVectorReduceSumNV(_, inst))
        return error;
      break;
    case spv::Op::OpCooperativeVectorMatrixMulNV:
    case spv::Op::OpCooperativeVectorMatrixMulAddNV:
      if (auto error = ValidateCooperativeVectorMatrixMulNV(_, inst))
        return error;
      break;
    case spv::Op::OpPtrEqual:
    case spv::Op::OpPtrNotEqual:
    case spv::Op::OpPtrDiff:
      if (auto error = ValidatePtrComparison(_, inst)) return error;
      break;
    case spv::Op::OpImageTexelPointer:
    case spv::Op::OpGenericPtrMemSemantics:
    default:
      break;
  }

  return SPV_SUCCESS;
}